

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

void deqp::gles31::bb::anon_unknown_11::copyNonWrittenData
               (BufferLayout *layout,BufferBlock *block,int instanceNdx,BlockDataPtr *srcBlockPtr,
               BlockDataPtr *dstBlockPtr,BufferVar *bufVar,SubTypeAccess *accessPath)

{
  int iVar1;
  BufferVarLayoutEntry *dstEntry;
  BlockDataPtr *accessPath_00;
  int iVar2;
  VarType curType;
  string apiName;
  
  accessPath_00 = dstBlockPtr;
  glu::SubTypeAccess::getType(&curType,accessPath);
  if (curType.m_type == TYPE_STRUCT) {
    iVar2 = 0;
    iVar1 = (int)(((long)((curType.m_data.structPtr)->m_members).
                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)((curType.m_data.structPtr)->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x38);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      glu::SubTypeAccess::member((SubTypeAccess *)&apiName,accessPath,iVar2);
      copyNonWrittenData(layout,block,instanceNdx,srcBlockPtr,dstBlockPtr,bufVar,
                         (SubTypeAccess *)&apiName);
      glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&apiName);
    }
  }
  else if (curType.m_type == TYPE_ARRAY) {
    if (curType.m_data.array.size == -1) {
      curType.m_data.array.size =
           (block->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[instanceNdx];
    }
    iVar2 = 0;
    iVar1 = curType.m_data.array.size;
    if (curType.m_data.array.size < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      glu::SubTypeAccess::element((SubTypeAccess *)&apiName,accessPath,iVar2);
      copyNonWrittenData(layout,block,instanceNdx,srcBlockPtr,dstBlockPtr,bufVar,
                         (SubTypeAccess *)&apiName);
      glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&apiName);
    }
  }
  else {
    (anonymous_namespace)::getAPIName_abi_cxx11_
              (&apiName,(_anonymous_namespace_ *)block,(BufferBlock *)bufVar,
               (BufferVar *)&accessPath->m_path,(TypeComponentVector *)accessPath_00);
    iVar1 = BufferLayout::getVariableIndex(layout,&apiName);
    dstEntry = (layout->bufferVars).
               super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar1;
    copyBufferVarData(dstEntry,dstBlockPtr,dstEntry,srcBlockPtr);
    std::__cxx11::string::~string((string *)&apiName);
  }
  glu::VarType::~VarType(&curType);
  return;
}

Assistant:

void copyNonWrittenData (
	const BufferLayout&			layout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			srcBlockPtr,
	const BlockDataPtr&			dstBlockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			copyNonWrittenData(layout, block, instanceNdx, srcBlockPtr, dstBlockPtr, bufVar, accessPath.element(elemNdx));
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			copyNonWrittenData(layout, block, instanceNdx, srcBlockPtr, dstBlockPtr, bufVar, accessPath.member(memberNdx));
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= layout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry& varLayout = layout.bufferVars[varNdx];
			copyBufferVarData(varLayout, dstBlockPtr, varLayout, srcBlockPtr);
		}
	}
}